

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_enlarge_visible(REF_CAVITY ref_cavity)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  REF_STATUS RVar6;
  uint uVar7;
  undefined8 in_RAX;
  undefined8 uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  REF_BOOL manifold;
  REF_BOOL visible;
  
  pRVar3 = ref_cavity->ref_grid->node;
  iVar1 = ref_cavity->node;
  if (pRVar3->ref_mpi->id == pRVar3->part[iVar1]) {
    _manifold = in_RAX;
    if (ref_cavity->debug != 0) {
      printf(" enlarge start %d tets %d faces\n",(ulong)(uint)ref_cavity->tet_list->n,
             (ulong)(uint)ref_cavity->nface);
    }
    RVar6 = 0;
    if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
      RVar6 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar6 == 0) {
        bVar5 = true;
        while (bVar5) {
          lVar11 = 8;
          bVar5 = false;
          for (lVar10 = 0; lVar10 < ref_cavity->maxface; lVar10 = lVar10 + 1) {
            pRVar4 = ref_cavity->f2n;
            iVar2 = *(int *)((long)pRVar4 + lVar11 + -8);
            if (((iVar1 != iVar2 && iVar2 != -1) && (iVar1 != *(int *)((long)pRVar4 + lVar11 + -4)))
               && (iVar1 != *(int *)((long)pRVar4 + lVar11))) {
              uVar7 = ref_cavity_visible(ref_cavity,(REF_INT)lVar10,&visible);
              if (uVar7 != 0) {
                pcVar9 = "free";
                uVar8 = 0x78b;
                goto LAB_001d7530;
              }
              if (visible == 0) {
                RVar6 = ref_cavity_enlarge_face(ref_cavity,(REF_INT)lVar10);
                if (RVar6 != 0) {
                  pcVar9 = "enlarge face";
                  uVar8 = 0x78d;
                  goto LAB_001d736e;
                }
                bVar5 = true;
                if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
                  if (ref_cavity->debug == 0) {
                    return 0;
                  }
                  uVar7 = ref_cavity_tec(ref_cavity,"enlarge.tec");
                  if (uVar7 == 0) {
                    return 0;
                  }
                  pcVar9 = "tec for enlarge_face fail";
                  uVar8 = 0x791;
                  goto LAB_001d7530;
                }
              }
            }
            lVar11 = lVar11 + 0xc;
          }
        }
        if (ref_cavity->debug != 0) {
          printf(" enlarge final %d tets %d faces\n",(ulong)(uint)ref_cavity->tet_list->n,
                 (ulong)(uint)ref_cavity->nface);
        }
        uVar7 = ref_cavity_manifold(ref_cavity,&manifold);
        if (uVar7 != 0) {
          pcVar9 = "manifold";
          uVar8 = 0x79f;
LAB_001d7530:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar8,"ref_cavity_enlarge_visible",(ulong)uVar7,pcVar9);
          return uVar7;
        }
        if (manifold == 0) {
          if (ref_cavity->debug != 0) {
            puts(" visible not manifold");
          }
          ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
          return 0;
        }
        ref_cavity->state = REF_CAVITY_VISIBLE;
        RVar6 = ref_cavity_verify_face_manifold(ref_cavity);
        if (RVar6 == 0) {
          return 0;
        }
        pcVar9 = "final manifold check";
        RVar6 = 1;
        uVar8 = 0x7a8;
      }
      else {
        pcVar9 = "initial manifold check";
        RVar6 = 1;
        uVar8 = 0x77f;
      }
LAB_001d736e:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar8,"ref_cavity_enlarge_visible",RVar6,pcVar9);
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x776,
           "ref_cavity_enlarge_visible","cavity part must own node");
    RVar6 = 1;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_visible(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT face;
  REF_BOOL visible;
  REF_BOOL keep_growing;
  REF_BOOL manifold;

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (ref_cavity_debug(ref_cavity))
    printf(" enlarge start %d tets %d faces\n",
           ref_list_n(ref_cavity_tet_list(ref_cavity)),
           ref_cavity_nface(ref_cavity));

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "initial manifold check");

  keep_growing = REF_TRUE;
  while (keep_growing) {
    keep_growing = REF_FALSE;
    each_ref_cavity_valid_face(ref_cavity, face) {
      /* skip a face attached to node */
      if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
          node == ref_cavity_f2n(ref_cavity, 1, face) ||
          node == ref_cavity_f2n(ref_cavity, 2, face))
        continue;

      RSS(ref_cavity_visible(ref_cavity, face, &visible), "free");
      if (!visible) {
        RSS(ref_cavity_enlarge_face(ref_cavity, face), "enlarge face");
        if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) {
          if (ref_cavity_debug(ref_cavity)) {
            RSS(ref_cavity_tec(ref_cavity, "enlarge.tec"),
                "tec for enlarge_face fail");
          }
          return REF_SUCCESS;
        }
        keep_growing = REF_TRUE;
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf(" enlarge final %d tets %d faces\n",
           ref_list_n(ref_cavity_tet_list(ref_cavity)),
           ref_cavity_nface(ref_cavity));

  RSS(ref_cavity_manifold(ref_cavity, &manifold), "manifold");
  if (!manifold) {
    if (ref_cavity_debug(ref_cavity)) printf(" visible not manifold\n");
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "final manifold check");

  return REF_SUCCESS;
}